

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O0

void __thiscall
slang::ast::EventListControl::visitExprs<no_dot_start_in_port_connection::MainVisitor&>
          (EventListControl *this,AlwaysFFVisitor *visitor)

{
  bool bVar1;
  iterator this_00;
  iterator visitor_00;
  reference ppTVar2;
  TimingControl *ev;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> *__range3;
  span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> *in_stack_ffffffffffffffc8;
  TimingControl *in_stack_ffffffffffffffd0;
  span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> *in_stack_ffffffffffffffd8;
  
  this_00 = std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>::begin
                      (in_stack_ffffffffffffffc8);
  visitor_00 = std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>::end
                         (in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffffe0);
    in_stack_ffffffffffffffd0 = *ppTVar2;
    TimingControl::visit<no_dot_start_in_port_connection::MainVisitor>
              ((TimingControl *)this_00._M_current,(AlwaysFFVisitor *)visitor_00._M_current);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto ev : events)
            ev->visit(visitor);
    }